

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

bool __thiscall minja::Value::get<bool>(Value *this,string *key,bool default_value)

{
  bool bVar1;
  Value *this_00;
  Value VStack_68;
  
  bVar1 = contains(this,key);
  if (bVar1) {
    Value(&VStack_68,key);
    this_00 = at(this,&VStack_68);
    default_value = get<bool>(this_00);
    ~Value(&VStack_68);
  }
  return default_value;
}

Assistant:

T get(const std::string & key, T default_value) const {
    if (!contains(key)) return default_value;
    return at(key).get<T>();
  }